

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::CheckFortran(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  ostream *poVar1;
  bool bVar2;
  string local_1e8;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream e;
  cmMakefile *mf_local;
  cmGlobalNinjaGenerator *this_local;
  
  bVar2 = (this->NinjaSupportsDyndeps & 1U) == 0;
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,
                             "The Ninja generator does not support Fortran using Ninja version\n  ")
    ;
    poVar1 = std::operator<<(poVar1,(string *)&this->NinjaVersion);
    poVar1 = std::operator<<(poVar1,"\ndue to lack of required features.  Ninja ");
    RequiredNinjaVersionForDyndeps_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,local_1c8);
    std::operator<<(poVar1," or higher is required.");
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    cmSystemTools::SetFatalErrorOccurred();
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckFortran(cmMakefile* mf) const
{
  if (this->NinjaSupportsDyndeps) {
    return true;
  }

  std::ostringstream e;
  /* clang-format off */
  e <<
    "The Ninja generator does not support Fortran using Ninja version\n"
    "  " << this->NinjaVersion << "\n"
    "due to lack of required features.  "
    "Ninja " << RequiredNinjaVersionForDyndeps() << " or higher is required."
    ;
  /* clang-format on */
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccurred();
  return false;
}